

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_tpl_row_mt_sync_read(AV1TplRowMultiThreadSync *tpl_row_mt_sync,int r,int c)

{
  long lVar1;
  pthread_mutex_t *__mutex;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  pthread_mutex_t *mutex;
  int nsync;
  
  lVar1 = in_RDI[3];
  if (in_ESI != 0) {
    __mutex = (pthread_mutex_t *)(*in_RDI + (long)(in_ESI + -1) * 0x28);
    pthread_mutex_lock(__mutex);
    while (*(int *)(in_RDI[2] + (long)(in_ESI + -1) * 4) - (int)lVar1 < in_EDX) {
      pthread_cond_wait((pthread_cond_t *)(in_RDI[1] + (long)(in_ESI + -1) * 0x30),__mutex);
    }
    pthread_mutex_unlock(__mutex);
  }
  return;
}

Assistant:

void av1_tpl_row_mt_sync_read(AV1TplRowMultiThreadSync *tpl_row_mt_sync, int r,
                              int c) {
#if CONFIG_MULTITHREAD
  int nsync = tpl_row_mt_sync->sync_range;

  if (r) {
    pthread_mutex_t *const mutex = &tpl_row_mt_sync->mutex_[r - 1];
    pthread_mutex_lock(mutex);

    while (c > tpl_row_mt_sync->num_finished_cols[r - 1] - nsync)
      pthread_cond_wait(&tpl_row_mt_sync->cond_[r - 1], mutex);
    pthread_mutex_unlock(mutex);
  }
#else
  (void)tpl_row_mt_sync;
  (void)r;
  (void)c;
#endif  // CONFIG_MULTITHREAD
}